

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::fixPosIncludesFrame(QWidgetPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QTLWExtra *pQVar3;
  QWindow *pQVar4;
  long lVar5;
  QWidgetPrivate *in_RDI;
  QTLWExtra *te;
  QWidget *q;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  QWidgetPrivate *in_stack_ffffffffffffffd0;
  QRect *this_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  QWidgetPrivate *this_01;
  
  this_01 = in_RDI;
  pQVar2 = q_func(in_RDI);
  pQVar3 = maybeTopData(in_stack_ffffffffffffffd0);
  if ((pQVar3 != (QTLWExtra *)0x0) && ((*(ushort *)&pQVar3->field_0xe0 >> 8 & 1) != 0)) {
    bVar1 = QWidget::testAttribute
                      ((QWidget *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (WidgetAttribute)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    if (bVar1) {
      *(ushort *)&pQVar3->field_0xe0 = *(ushort *)&pQVar3->field_0xe0 & 0xfeff;
    }
    else {
      pQVar4 = QWidget::windowHandle((QWidget *)in_stack_ffffffffffffffd0);
      if (pQVar4 != (QWindow *)0x0) {
        QWidget::windowHandle((QWidget *)in_stack_ffffffffffffffd0);
        lVar5 = QWindow::handle();
        if ((lVar5 != 0) &&
           (updateFrameStrut(this_01), (*(uint *)&pQVar2->data->field_0x10 >> 0xc & 1) == 0)) {
          this_00 = &(in_RDI->data).crect;
          QRect::x((QRect *)0x360e88);
          QRect::y((QRect *)0x360e9d);
          QRect::translate(this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
          *(ushort *)&pQVar3->field_0xe0 = *(ushort *)&pQVar3->field_0xe0 & 0xfeff;
        }
      }
    }
  }
  return;
}

Assistant:

void QWidgetPrivate::fixPosIncludesFrame()
{
    Q_Q(QWidget);
    if (QTLWExtra *te = maybeTopData()) {
        if (te->posIncludesFrame) {
            // For Qt::WA_DontShowOnScreen, assume a frame of 0 (for
            // example, in QGraphicsProxyWidget).
            if (q->testAttribute(Qt::WA_DontShowOnScreen)) {
                te->posIncludesFrame = 0;
            } else {
                if (q->windowHandle() && q->windowHandle()->handle()) {
                    updateFrameStrut();
                    if (!q->data->fstrut_dirty) {
                        data.crect.translate(te->frameStrut.x(), te->frameStrut.y());
                        te->posIncludesFrame = 0;
                    }
                } // windowHandle()
            } // !WA_DontShowOnScreen
        } // posIncludesFrame
    } // QTLWExtra
}